

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::removeColReal(SoPlexBase<double> *this,int i)

{
  int iVar1;
  RangeType *pRVar2;
  uint in_ESI;
  SoPlexBase<double> *in_RDI;
  int in_stack_ffffffffffffffcc;
  SoPlexBase<double> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  DataArray<soplex::SoPlexBase<double>::RangeType> *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  RangeType RVar3;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar4;
  
  _removeColReal((SoPlexBase<double> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                 ,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  iVar1 = intParam(in_RDI,SYNCMODE);
  if (iVar1 == 1) {
    (*(in_RDI->_rationalLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x15])(in_RDI->_rationalLP,(ulong)in_ESI);
    uVar4 = in_ESI;
    iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x1d6c6a);
    if ((int)uVar4 < iVar1) {
      this_00 = &in_RDI->_colTypes;
      iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)0x1d6c94);
      pRVar2 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[](this_00,iVar1);
      RVar3 = *pRVar2;
      pRVar2 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                         (&in_RDI->_colTypes,in_ESI);
      *pRVar2 = RVar3;
    }
    in_stack_ffffffffffffffd0 = (SoPlexBase<double> *)&in_RDI->_colTypes;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x1d6ce1);
    DataArray<soplex::SoPlexBase<double>::RangeType>::reSize
              ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  }
  _invalidateSolution(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void SoPlexBase<R>::removeColReal(int i)
{
   assert(_realLP != nullptr);

   _removeColReal(i);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->removeCol(i);

      // only swap elements if not the last one was removed
      if(i < _rationalLP->nCols())
      {
         _colTypes[i] = _colTypes[_rationalLP->nCols()];
         assert(_colTypes[i] == _rangeTypeRational(lowerRational(i), upperRational(i)));
      }

      _colTypes.reSize(_rationalLP->nCols());
   }

   _invalidateSolution();
}